

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InvalidInputException::
InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2)

{
  pointer pcVar1;
  unsigned_long in_R9;
  string local_70;
  string local_50;
  
  pcVar1 = (params->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + params->_M_string_length);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long>
            (&local_50,(Exception *)msg,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1,params_2,
             in_R9);
  InvalidInputException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}